

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::CropParameter::InternalSerializeWithCachedSizesToArray
          (CropParameter *this,bool deterministic,uint8 *target)

{
  uint8 *puVar1;
  UnknownFieldSet *unknown_fields;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1,this->axis_,target);
  }
  puVar1 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(2,&this->offset_,target);
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return puVar1;
  }
  unknown_fields = CropParameter::unknown_fields(this);
  puVar1 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,puVar1);
  return puVar1;
}

Assistant:

::google::protobuf::uint8* CropParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.CropParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 axis = 1 [default = 2];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->axis(), target);
  }

  // repeated uint32 offset = 2;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(2, this->offset_, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.CropParameter)
  return target;
}